

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CurrentGenerator.cpp
# Opt level: O3

Event * __thiscall CurrentGenerator::update(CurrentGenerator *this,double n_dt)

{
  double dVar1;
  double dVar2;
  CurrentGenerator_param *pCVar3;
  Event *pEVar4;
  Clock *pCVar5;
  double dVar6;
  result_type_conflict rVar7;
  double dVar8;
  
  pCVar3 = this->param;
  dVar1 = pCVar3->ac_hz;
  pEVar4 = (Event *)operator_new(0x28);
  dVar2 = pCVar3->I;
  if (dVar1 <= 0.0) {
    rVar7 = std::normal_distribution<double>::operator()
                      (&this->distribution,&this->generator,&(this->distribution)._M_param);
    dVar1 = this->param->noiseOn;
    pEVar4->_vptr_Event = (_func_int **)&PTR_setWeight_0010fb78;
    pEVar4[1]._vptr_Event = (_func_int **)0x0;
    *(undefined8 *)&pEVar4[1].type = 0;
    pEVar4->type = Current;
    pCVar5 = Clock::getInstance();
    dVar6 = Clock::getCurrentTime(pCVar5);
    pEVar4->eventTime = dVar6;
    pEVar4[1]._vptr_Event = (_func_int **)(rVar7 * dVar1 + dVar2);
  }
  else {
    dVar6 = Clock::getCurrentTime(this->clock);
    dVar6 = sin(dVar1 * 6.2831853071794 * dVar6);
    rVar7 = std::normal_distribution<double>::operator()
                      (&this->distribution,&this->generator,&(this->distribution)._M_param);
    dVar1 = this->param->noiseOn;
    pEVar4->_vptr_Event = (_func_int **)&PTR_setWeight_0010fb78;
    pEVar4[1]._vptr_Event = (_func_int **)0x0;
    *(undefined8 *)&pEVar4[1].type = 0;
    pEVar4->type = Current;
    pCVar5 = Clock::getInstance();
    dVar8 = Clock::getCurrentTime(pCVar5);
    pEVar4->eventTime = dVar8;
    pEVar4[1]._vptr_Event = (_func_int **)(rVar7 * dVar1 + dVar2 + dVar6);
  }
  *(undefined8 *)&pEVar4[1].type = 0x3ff0000000000000;
  return pEVar4;
}

Assistant:

Event* CurrentGenerator::update(double n_dt) {
    if(param->ac_hz > 0) {
        return new CurrentEvent(param->I + sin(2*3.1415926535897*param->ac_hz*clock->getCurrentTime()) + distribution(generator)*param->noiseOn, 1.0);
    }
    return new CurrentEvent(param->I + distribution(generator)*param->noiseOn, 1.0);
}